

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O2

void __thiscall
CaDiCaL::Proof::add_derived_unit_clause
          (Proof *this,uint64_t id,int internal_unit,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *chain)

{
  pointer puVar1;
  unsigned_long *cid;
  pointer __x;
  
  add_literal(this,internal_unit);
  puVar1 = (chain->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (chain->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start; __x != puVar1; __x = __x + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->proof_chain,__x);
  }
  this->clause_id = id;
  this->redundant = false;
  add_derived_clause(this);
  return;
}

Assistant:

void Proof::add_derived_unit_clause (uint64_t id, int internal_unit,
                                     const vector<uint64_t> &chain) {
  LOG ("PROOF adding unit clause %d", internal_unit);
  assert (proof_chain.empty ());
  assert (clause.empty ());
  add_literal (internal_unit);
  for (const auto &cid : chain)
    proof_chain.push_back (cid);
  clause_id = id;
  redundant = false;
  add_derived_clause ();
}